

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall trompeloeil::trace_agent::~trace_agent(trace_agent *this)

{
  tracer *ptVar1;
  char *pcVar2;
  unsigned_long uVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  ptVar1 = this->t;
  if (ptVar1 != (tracer *)0x0) {
    pcVar2 = (this->loc).file;
    uVar3 = (this->loc).line;
    std::__cxx11::stringbuf::str();
    (*(code *)**(undefined8 **)ptVar1)(ptVar1,pcVar2,uVar3,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->os);
  std::ios_base::~ios_base((ios_base *)&this->field_0x88);
  return;
}

Assistant:

~trace_agent()
    {
      if (t)
      {
        t->trace(loc.file, loc.line, os.str());
      }
    }